

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::JumpPattern::TryToGenerateCode
          (JumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstJumpPtr this_00;
  CLabelStatement *this_01;
  CJumpStatement *local_b0;
  CLabel local_90;
  CLabel local_70;
  shared_ptr<AssemblyCode::JumpCommand> local_50;
  CJumpStatement *local_40;
  ConstJumpPtr jumpPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  JumpPattern *this_local;
  
  jumpPtr = (ConstJumpPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_b0 = (CJumpStatement *)0x0;
  }
  else {
    local_b0 = (CJumpStatement *)__dynamic_cast(tree,&INode::typeinfo,&CJumpStatement::typeinfo,0);
  }
  this_00 = jumpPtr;
  local_40 = local_b0;
  if (local_b0 != (CJumpStatement *)0x0) {
    this_01 = CJumpStatement::getLabel(local_b0);
    CLabelStatement::Label(&local_90,this_01);
    CLabel::ToString_abi_cxx11_(&local_70);
    std::make_shared<AssemblyCode::JumpCommand,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::JumpCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)this_00,&local_50);
    std::shared_ptr<AssemblyCode::JumpCommand>::~shared_ptr(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    CLabel::~CLabel(&local_90);
  }
  return local_b0 != (CJumpStatement *)0x0;
}

Assistant:

bool IRT::JumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                          AssemblyCommands &commands ) {
    ConstJumpPtr jumpPtr = dynamic_cast<ConstJumpPtr>(tree);
    if ( jumpPtr ) {
        commands.emplace_back(
                std::make_shared<AssemblyCode::JumpCommand>( jumpPtr->getLabel( )->Label( ).ToString( )));
        return true;
    }
    return false;
}